

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

UnlocalizedNumberFormatter * __thiscall
icu_63::number::NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::macros
          (UnlocalizedNumberFormatter *__return_storage_ptr__,
          NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter> *this,
          MacroProps *macros)

{
  MacroProps *macros_local;
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter> *this_local;
  UnlocalizedNumberFormatter *copy;
  
  UnlocalizedNumberFormatter::UnlocalizedNumberFormatter(__return_storage_ptr__,this);
  impl::MacroProps::operator=((MacroProps *)__return_storage_ptr__,macros);
  return __return_storage_ptr__;
}

Assistant:

Derived NumberFormatterSettings<Derived>::macros(impl::MacroProps&& macros) const& {
    Derived copy(*this);
    copy.fMacros = std::move(macros);
    return copy;
}